

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

unique_ptr<wallet::CKeyMetadata,_std::default_delete<wallet::CKeyMetadata>_> __thiscall
wallet::DescriptorScriptPubKeyMan::GetMetadata(DescriptorScriptPubKeyMan *this,CTxDestination *dest)

{
  _func_int **pp_Var1;
  undefined8 store;
  int iVar2;
  CTxDestination *in_RDX;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock70;
  CKeyID key_id;
  KeyOriginInfo orig;
  unique_lock<std::recursive_mutex> uStack_78;
  undefined1 local_68 [32];
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  shared_count local_30;
  
  local_30.pi_ = *(sp_counted_base **)(in_FS_OFFSET + 0x28);
  GetScriptForDestination((CScript *)(local_68 + 0x18),in_RDX);
  GetSigningProvider((DescriptorScriptPubKeyMan *)local_68,(CScript *)dest,
                     SUB81((CScript *)(local_68 + 0x18),0));
  store = local_68._0_8_;
  local_68._0_8_ =
       (__uniq_ptr_impl<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>)0x0;
  std::unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>::~unique_ptr
            ((unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> *)local_68)
  ;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)(local_68 + 0x18));
  if ((_Tuple_impl<0UL,_FlatSigningProvider_*,_std::default_delete<FlatSigningProvider>_>)store ==
      (FlatSigningProvider *)0x0) {
    (this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan = (_func_int **)0x0;
  }
  else {
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetKeyForDestination((CKeyID *)local_68,(SigningProvider *)store,in_RDX);
    iVar2 = (*(*(_func_int ***)store)[7])(store,local_68,local_68 + 0x18);
    if ((char)iVar2 == '\0') {
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
      (this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan = (_func_int **)0x0;
    }
    else {
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&uStack_78,
                 (AnnotatedMixin<std::recursive_mutex> *)
                 ((long)&dest[7].
                         super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         .
                         super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         .
                         super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         .
                         super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         .
                         super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         .
                         super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         ._M_u + 0x20),"cs_desc_man",
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                 ,0xa3a,false);
      std::make_unique<wallet::CKeyMetadata>();
      KeyOriginInfo::operator=
                ((KeyOriginInfo *)((this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan + 9),
                 (KeyOriginInfo *)(local_68 + 0x18));
      pp_Var1 = (this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan;
      *(undefined1 *)(pp_Var1 + 0xd) = 1;
      pp_Var1[1] = *(_func_int **)
                    &dest[5].
                     super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     .
                     super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     .
                     super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     .
                     super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     .
                     super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     .
                     super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     ._M_u;
      std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_78);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
    }
    (*(*(_func_int ***)store)[1])(store);
  }
  if (*(sp_counted_base **)(in_FS_OFFSET + 0x28) == local_30.pi_) {
    return (__uniq_ptr_data<wallet::CKeyMetadata,_std::default_delete<wallet::CKeyMetadata>,_true,_true>
            )(__uniq_ptr_data<wallet::CKeyMetadata,_std::default_delete<wallet::CKeyMetadata>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<CKeyMetadata> DescriptorScriptPubKeyMan::GetMetadata(const CTxDestination& dest) const
{
    std::unique_ptr<SigningProvider> provider = GetSigningProvider(GetScriptForDestination(dest));
    if (provider) {
        KeyOriginInfo orig;
        CKeyID key_id = GetKeyForDestination(*provider, dest);
        if (provider->GetKeyOrigin(key_id, orig)) {
            LOCK(cs_desc_man);
            std::unique_ptr<CKeyMetadata> meta = std::make_unique<CKeyMetadata>();
            meta->key_origin = orig;
            meta->has_key_origin = true;
            meta->nCreateTime = m_wallet_descriptor.creation_time;
            return meta;
        }
    }
    return nullptr;
}